

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::clearFile(FileServer *this,TURI *uri)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  pointer __s2;
  size_t __n;
  void *pvVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var8;
  pthread_mutex_t *__mutex;
  long lVar9;
  ulong uVar10;
  long *local_98 [2];
  long local_88 [2];
  undefined8 local_78;
  long *local_70 [2];
  long local_60 [2];
  undefined4 local_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  _Var8._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&((_Var8._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_>;
  uVar7 = (*(int *)&((_Bit_iterator *)((long)&(_Var8._M_head_impl)->fileUsed + 0x10))->
                    super__Bit_iterator_base - (int)lVar2) * 8 +
          *(uint *)((long)&(_Var8._M_head_impl)->fileUsed + 0x18);
  if (0 < (int)uVar7) {
    lVar3 = *(long *)&((_Var8._M_head_impl)->files).
                      super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
    ;
    __s2 = (uri->_M_dataplus)._M_p;
    __n = uri->_M_string_length;
    lVar9 = 0;
    uVar10 = 0;
    do {
      if ((*(size_t *)(lVar3 + 8 + lVar9) == __n) &&
         ((__n == 0 || (iVar6 = bcmp(*(void **)(lVar3 + lVar9),__s2,__n), iVar6 == 0)))) {
        bVar5 = (byte)uVar10 & 0x3f;
        puVar1 = (ulong *)(lVar2 + (uVar10 >> 6 & 0x3ffffff) * 8);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"?","");
        local_78 = 0;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"?","");
        local_50 = 0;
        local_48 = (void *)0x0;
        uStack_40 = 0;
        local_38 = 0;
        lVar2 = *(long *)&(((this->m_impl)._M_t.
                            super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                            .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)
                          ->files).
                          super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
        ;
        std::__cxx11::string::operator=((string *)(lVar2 + lVar9),(string *)local_98);
        lVar2 = lVar2 + lVar9;
        *(undefined8 *)(lVar2 + 0x20) = local_78;
        std::__cxx11::string::operator=((string *)(lVar2 + 0x28),(string *)local_70);
        *(undefined4 *)(lVar2 + 0x48) = local_50;
        pvVar4 = *(void **)(lVar2 + 0x50);
        lVar3 = *(long *)(lVar2 + 0x60);
        *(void **)(lVar2 + 0x50) = local_48;
        *(undefined8 *)(lVar2 + 0x58) = uStack_40;
        *(long *)(lVar2 + 0x60) = local_38;
        local_38 = 0;
        local_48 = (void *)0x0;
        uStack_40 = 0;
        if ((pvVar4 != (void *)0x0) &&
           (operator_delete(pvVar4,lVar3 - (long)pvVar4), local_48 != (void *)0x0)) {
          operator_delete(local_48,local_38 - (long)local_48);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        _Var8._M_head_impl =
             (this->m_impl)._M_t.
             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
        break;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x68;
    } while (uVar10 < uVar7);
  }
  (_Var8._M_head_impl)->changedFileInfos = true;
  pthread_mutex_unlock(__mutex);
  return true;
}

Assistant:

bool FileServer::clearFile(const TURI & uri) {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            if (m_impl->files[i].info.uri != uri) {
                continue;
            }
            m_impl->fileUsed[i] = false;
            m_impl->files[i] = {};

            break;
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}